

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderEntPush(xmlTextReaderPtr reader,xmlNodePtr value)

{
  int iVar1;
  xmlGenericErrorFunc p_Var2;
  xmlNodePtr *ppxVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlNodePtr value_local;
  xmlTextReaderPtr reader_local;
  
  if (reader->entMax < 1) {
    reader->entMax = 10;
    ppxVar3 = (xmlNodePtr *)(*xmlMalloc)((long)reader->entMax << 3);
    reader->entTab = ppxVar3;
    if (reader->entTab == (xmlNodePtr *)0x0) {
      pp_Var4 = __xmlGenericError();
      p_Var2 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var2)(*ppvVar5,"xmlMalloc failed !\n");
      return 0;
    }
  }
  if (reader->entMax <= reader->entNr) {
    reader->entMax = reader->entMax << 1;
    ppxVar3 = (xmlNodePtr *)(*xmlRealloc)(reader->entTab,(long)reader->entMax << 3);
    reader->entTab = ppxVar3;
    if (reader->entTab == (xmlNodePtr *)0x0) {
      pp_Var4 = __xmlGenericError();
      p_Var2 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var2)(*ppvVar5,"xmlRealloc failed !\n");
      return 0;
    }
  }
  reader->entTab[reader->entNr] = value;
  reader->ent = value;
  iVar1 = reader->entNr;
  reader->entNr = iVar1 + 1;
  return iVar1;
}

Assistant:

static int
xmlTextReaderEntPush(xmlTextReaderPtr reader, xmlNodePtr value)
{
    if (reader->entMax <= 0) {
	reader->entMax = 10;
	reader->entTab = (xmlNodePtr *) xmlMalloc(reader->entMax *
		                                  sizeof(reader->entTab[0]));
        if (reader->entTab == NULL) {
            xmlGenericError(xmlGenericErrorContext, "xmlMalloc failed !\n");
            return (0);
        }
    }
    if (reader->entNr >= reader->entMax) {
        reader->entMax *= 2;
        reader->entTab =
            (xmlNodePtr *) xmlRealloc(reader->entTab,
                                      reader->entMax *
                                      sizeof(reader->entTab[0]));
        if (reader->entTab == NULL) {
            xmlGenericError(xmlGenericErrorContext, "xmlRealloc failed !\n");
            return (0);
        }
    }
    reader->entTab[reader->entNr] = value;
    reader->ent = value;
    return (reader->entNr++);
}